

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tb.cc
# Opt level: O0

string * __thiscall
kratos::Sequence::to_string_abi_cxx11_(string *__return_storage_ptr__,Sequence *this)

{
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(kratos::Var_*)>
  local_40;
  anon_class_1_0_00000001 local_19;
  Sequence *pSStack_18;
  anon_class_1_0_00000001 func;
  Sequence *this_local;
  
  pSStack_18 = this;
  std::function<std::__cxx11::string(kratos::Var*)>::
  function<kratos::Sequence::to_string()const::__0&,void>
            ((function<std::__cxx11::string(kratos::Var*)> *)&local_40,&local_19);
  to_string(__return_storage_ptr__,this,&local_40);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(kratos::Var_*)>
  ::~function(&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string Sequence::to_string() const {
    auto func = [](Var *v) { return v->handle_name(true); };
    return to_string(func);
}